

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

TaggedUnionExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TaggedUnionExpressionSyntax,slang::syntax::TaggedUnionExpressionSyntax_const&>
          (BumpAllocator *this,TaggedUnionExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  ExpressionSyntax *pEVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  SyntaxKind SVar13;
  undefined4 uVar14;
  TaggedUnionExpressionSyntax *pTVar15;
  
  pTVar15 = (TaggedUnionExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((TaggedUnionExpressionSyntax *)this->endPtr < pTVar15 + 1) {
    pTVar15 = (TaggedUnionExpressionSyntax *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pTVar15 + 1);
  }
  SVar13 = (args->super_ExpressionSyntax).super_SyntaxNode.kind;
  uVar14 = *(undefined4 *)&(args->super_ExpressionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ExpressionSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_ExpressionSyntax).super_SyntaxNode.previewNode;
  TVar9 = (args->tagged).kind;
  uVar10 = (args->tagged).field_0x2;
  NVar11.raw = (args->tagged).numFlags.raw;
  uVar12 = (args->tagged).rawLen;
  pIVar3 = (args->tagged).info;
  TVar5 = (args->member).kind;
  uVar6 = (args->member).field_0x2;
  NVar7.raw = (args->member).numFlags.raw;
  uVar8 = (args->member).rawLen;
  pEVar4 = args->expr;
  (pTVar15->member).info = (args->member).info;
  pTVar15->expr = pEVar4;
  (pTVar15->tagged).info = pIVar3;
  (pTVar15->member).kind = TVar5;
  (pTVar15->member).field_0x2 = uVar6;
  (pTVar15->member).numFlags = (NumericTokenFlags)NVar7.raw;
  (pTVar15->member).rawLen = uVar8;
  (pTVar15->super_ExpressionSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pTVar15->tagged).kind = TVar9;
  (pTVar15->tagged).field_0x2 = uVar10;
  (pTVar15->tagged).numFlags = (NumericTokenFlags)NVar11.raw;
  (pTVar15->tagged).rawLen = uVar12;
  (pTVar15->super_ExpressionSyntax).super_SyntaxNode.kind = SVar13;
  *(undefined4 *)&(pTVar15->super_ExpressionSyntax).super_SyntaxNode.field_0x4 = uVar14;
  (pTVar15->super_ExpressionSyntax).super_SyntaxNode.parent = pSVar1;
  return pTVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }